

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O1

void __thiscall Generator::_run(Generator *this,search *sch,input *in,output *out)

{
  undefined1 *puVar1;
  size_type sVar2;
  pointer pcVar3;
  output *poVar4;
  pointer pnVar5;
  char cVar6;
  action aVar7;
  int iVar8;
  long *plVar9;
  predictor *ppVar10;
  Trie *pTVar11;
  ulong uVar12;
  long *plVar13;
  uint uVar14;
  long lVar15;
  size_type sVar16;
  pointer pnVar17;
  pointer pnVar18;
  long lVar19;
  float fVar20;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> all;
  string tmp;
  vector<nextstr,_std::allocator<nextstr>_> next;
  nextstr xx;
  v_array<unsigned_int> ref;
  IncrementalEditDistance ied;
  ezexample ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  ulong local_518;
  float local_50c;
  output *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  input *local_4e0;
  Trie *local_4d8;
  float local_4cc;
  vector<nextstr,_std::allocator<nextstr>_> local_4c8;
  long *local_4b0;
  long local_4a8;
  long local_4a0;
  long lStack_498;
  size_type local_490;
  search *local_488;
  Generator *local_480;
  long local_478;
  long *local_470;
  long local_468;
  long local_460;
  undefined4 uStack_458;
  undefined4 uStack_454;
  long *local_450;
  long local_448;
  long local_440;
  undefined4 uStack_438;
  undefined4 uStack_434;
  long *local_430;
  long local_428;
  long local_420;
  undefined4 uStack_418;
  undefined4 uStack_414;
  ulong local_410;
  ulong local_408;
  undefined8 local_400;
  undefined1 local_3f8 [32];
  float local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2b8 [2];
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  v_array<unsigned_int> local_258;
  IncrementalEditDistance local_238;
  ezexample local_1a8;
  
  local_488 = sch;
  IncrementalEditDistance::IncrementalEditDistance(&local_238,&in->out,1,1,1);
  pTVar11 = this->dict;
  local_258.end_array = (uint *)0x0;
  local_258.erase_count = 0;
  local_258._begin = (uint *)0x0;
  local_258._end = (uint *)0x0;
  sVar2 = (in->in)._M_string_length;
  local_4e0 = in;
  local_480 = this;
  std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,0x27b3aa);
  local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar14 = (uint)sVar2;
  local_490 = sVar2;
  if (0 < (int)uVar14) {
    puVar1 = local_3f8 + 8;
    local_4cc = (float)(int)uVar14;
    local_408 = (ulong)(uVar14 & 0x7fffffff);
    iVar8 = 1;
    if (1 < (int)(uVar14 * 2)) {
      iVar8 = uVar14 * 2;
    }
    local_410 = (ulong)(iVar8 + 1);
    local_518 = 1;
    local_478 = 2;
    local_508 = out;
    do {
      poVar4 = local_508;
      ezexample::ezexample
                (&local_1a8,
                 (local_480->
                 super_SearchTask<input,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).vw_obj,false,(vw *)0x0);
      ezexample::addns(&local_1a8,'l');
      local_400 = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"in","");
      ezexample::addf(&local_1a8,(string *)&local_400,local_4cc);
      if (local_400 != puVar1) {
        operator_delete(local_400);
      }
      local_400 = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"out","");
      ezexample::addf(&local_1a8,(string *)&local_400,(float)(int)local_518);
      if (local_400 != puVar1) {
        operator_delete(local_400);
      }
      if (local_518 != local_408) {
        local_400 = puVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"diff","");
        ezexample::addf(&local_1a8,(string *)&local_400,(float)((int)local_490 - (int)local_518));
        if (local_400 != puVar1) {
          operator_delete(local_400);
        }
      }
      ezexample::addns(&local_1a8,'s');
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      local_4d8 = pTVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"$","");
      lVar15 = local_518 - 0xf;
      lVar19 = local_478;
      if (lVar15 < 1) {
        lVar15 = 0;
      }
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_400,(poVar4->_M_dataplus)._M_p[lVar19 + -1],&local_500);
        std::__cxx11::string::operator=((string *)&local_500,(string *)&local_400);
        if (local_400 != puVar1) {
          operator_delete(local_400);
        }
        std::operator+(&local_278,"p=",&local_500);
        local_400 = puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_400,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        ezexample::addf(&local_1a8,(string *)&local_400,1.0);
        if (local_400 != puVar1) {
          operator_delete(local_400);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        lVar19 = lVar19 + -1;
      } while (lVar15 < lVar19);
      ezexample::addns(&local_1a8,'c');
      sVar2 = poVar4->_M_string_length;
      if (sVar2 != 0) {
        sVar16 = 0;
        do {
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_538,'\x01');
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,0x27b3b9);
          local_450 = &local_440;
          plVar13 = plVar9 + 2;
          if ((long *)*plVar9 == plVar13) {
            local_440 = *plVar13;
            uStack_438 = (undefined4)plVar9[3];
            uStack_434 = *(undefined4 *)((long)plVar9 + 0x1c);
          }
          else {
            local_440 = *plVar13;
            local_450 = (long *)*plVar9;
          }
          local_448 = plVar9[1];
          *plVar9 = (long)plVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          local_400 = puVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_400,local_450,local_448 + (long)local_450);
          ezexample::addf(&local_1a8,(string *)&local_400,1.0);
          if (local_400 != puVar1) {
            operator_delete(local_400);
          }
          if (local_450 != &local_440) {
            operator_delete(local_450);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p);
          }
          sVar16 = sVar16 + 1;
        } while (sVar2 != sVar16);
      }
      local_400 = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"c=$","");
      poVar4 = local_508;
      ezexample::addf(&local_1a8,(string *)&local_400,1.0);
      if (local_400 != puVar1) {
        operator_delete(local_400);
      }
      ezexample::addns(&local_1a8,'w');
      std::__cxx11::string::_M_replace
                ((ulong)&local_500,0,(char *)local_500._M_string_length,0x27b199);
      sVar2 = poVar4->_M_string_length;
      if (sVar2 != 0) {
        pcVar3 = (local_508->_M_dataplus)._M_p;
        sVar16 = 0;
        do {
          cVar6 = pcVar3[sVar16];
          if (cVar6 != '^') {
            if (cVar6 == ' ') {
              std::operator+(&local_538,"w=",&local_500);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_538);
              local_470 = &local_460;
              plVar13 = plVar9 + 2;
              if ((long *)*plVar9 == plVar13) {
                local_460 = *plVar13;
                uStack_458 = (undefined4)plVar9[3];
                uStack_454 = *(undefined4 *)((long)plVar9 + 0x1c);
              }
              else {
                local_460 = *plVar13;
                local_470 = (long *)*plVar9;
              }
              local_468 = plVar9[1];
              *plVar9 = (long)plVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              local_400 = puVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_400,local_470,local_468 + (long)local_470);
              ezexample::addf(&local_1a8,(string *)&local_400,1.0);
              if (local_400 != puVar1) {
                operator_delete(local_400);
              }
              if (local_470 != &local_460) {
                operator_delete(local_470);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) {
                operator_delete(local_538._M_dataplus._M_p);
              }
              std::__cxx11::string::_M_replace
                        ((ulong)&local_500,0,(char *)local_500._M_string_length,0x27b199);
            }
            else {
              std::__cxx11::string::push_back('\0');
            }
          }
          sVar16 = sVar16 + 1;
        } while (sVar2 != sVar16);
      }
      std::operator+(&local_298,"w=",&local_500);
      pTVar11 = local_4d8;
      local_400 = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_400,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      ezexample::addf(&local_1a8,(string *)&local_400,1.0);
      if (local_400 != puVar1) {
        operator_delete(local_400);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      pnVar18 = local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pnVar5 = local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pTVar11 != (Trie *)0x0) {
        pnVar17 = local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
            super__Vector_impl_data._M_start) {
          do {
            pcVar3 = (pnVar17->s)._M_dataplus._M_p;
            if (&(pnVar17->s).field_2 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3) {
              operator_delete(pcVar3);
            }
            pnVar17 = pnVar17 + 1;
          } while (pnVar17 != pnVar18);
          local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
          super__Vector_impl_data._M_finish = pnVar5;
        }
        Trie::get_next(local_4d8,(char *)0x0,&local_4c8);
        ezexample::addns(&local_1a8,'d');
        pnVar5 = local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          fVar20 = 0.0;
        }
        else {
          local_50c = 0.0;
          pnVar18 = local_4c8.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            local_400 = *(undefined1 **)pnVar18;
            local_3f8._0_8_ = local_3f8 + 0x10;
            pcVar3 = (pnVar18->s)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3f8,pcVar3,pcVar3 + (pnVar18->s)._M_string_length);
            local_3d8 = pnVar18->sw;
            if (0.0 < local_400._4_4_) {
              local_2b8[0] = &local_2a8;
              std::__cxx11::string::_M_construct((ulong)local_2b8,'\x01');
              plVar9 = (long *)std::__cxx11::string::replace
                                         ((ulong)local_2b8,0,(char *)0x0,0x27b3b9);
              local_4b0 = &local_4a0;
              plVar13 = plVar9 + 2;
              if ((long *)*plVar9 == plVar13) {
                local_4a0 = *plVar13;
                lStack_498 = plVar9[3];
              }
              else {
                local_4a0 = *plVar13;
                local_4b0 = (long *)*plVar9;
              }
              local_4a8 = plVar9[1];
              *plVar9 = (long)plVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              fVar20 = local_400._4_4_;
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_538,local_4b0,local_4a8 + (long)local_4b0);
              ezexample::addf(&local_1a8,&local_538,fVar20);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) {
                operator_delete(local_538._M_dataplus._M_p);
              }
              if (local_4b0 != &local_4a0) {
                operator_delete(local_4b0);
              }
              if (local_2b8[0] != &local_2a8) {
                operator_delete(local_2b8[0]);
              }
            }
            if (0.0 < local_3d8) {
              std::operator+(&local_2d8,"mc=",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3f8);
              fVar20 = local_3d8;
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_538,local_2d8._M_dataplus._M_p,
                         local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
              ezexample::addf(&local_1a8,&local_538,fVar20);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) {
                operator_delete(local_538._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p);
              }
            }
            fVar20 = local_3d8;
            if ((example *)local_3f8._0_8_ != (example *)(local_3f8 + 0x10)) {
              operator_delete((void *)local_3f8._0_8_);
            }
            if (fVar20 <= local_50c) {
              fVar20 = local_50c;
            }
            pnVar18 = pnVar18 + 1;
            local_50c = fVar20;
          } while (pnVar18 != pnVar5);
        }
        if (0.0 < fVar20) {
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_538,'\x01');
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,0x27b3bc);
          plVar13 = plVar9 + 2;
          if ((long *)*plVar9 == plVar13) {
            local_420 = *plVar13;
            uStack_418 = (undefined4)plVar9[3];
            uStack_414 = *(undefined4 *)((long)plVar9 + 0x1c);
            local_430 = &local_420;
          }
          else {
            local_420 = *plVar13;
            local_430 = (long *)*plVar9;
          }
          local_428 = plVar9[1];
          *plVar9 = (long)plVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          local_400 = puVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_400,local_430,local_428 + (long)local_430);
          ezexample::addf(&local_1a8,(string *)&local_400,fVar20);
          if (local_400 != puVar1) {
            operator_delete(local_400);
          }
          if (local_430 != &local_420) {
            operator_delete(local_430);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p);
          }
        }
      }
      ezexample::addns(&local_1a8,'i');
      std::__cxx11::string::_M_replace
                ((ulong)&local_500,0,(char *)local_500._M_string_length,0x27b199);
      sVar2 = (local_4e0->in)._M_string_length;
      if (sVar2 != 0) {
        pcVar3 = (local_4e0->in)._M_dataplus._M_p;
        sVar16 = 0;
        do {
          if (pcVar3[sVar16] == ' ') {
            std::operator+(&local_2f8,"w=",&local_500);
            local_400 = puVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_400,local_2f8._M_dataplus._M_p,
                       local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
            ezexample::addf(&local_1a8,(string *)&local_400,1.0);
            if (local_400 != puVar1) {
              operator_delete(local_400);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p);
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&local_500,0,(char *)local_500._M_string_length,0x27b199);
          }
          else {
            std::__cxx11::string::push_back('\0');
          }
          sVar16 = sVar16 + 1;
        } while (sVar2 != sVar16);
      }
      std::operator+(&local_318,"w=",&local_500);
      pTVar11 = local_4d8;
      local_400 = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_400,local_318._M_dataplus._M_p,
                 local_318._M_dataplus._M_p + local_318._M_string_length);
      ezexample::addf(&local_1a8,(string *)&local_400,1.0);
      if (local_400 != puVar1) {
        operator_delete(local_400);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p);
      }
      v_array<unsigned_int>::clear(&local_258);
      IncrementalEditDistance::all_next
                ((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  *)&local_538,&local_238);
      Search::predictor::predictor((predictor *)&local_400,local_488,(ptag)local_518);
      if (local_1a8.example_changed_since_prediction == true) {
        ezexample::mini_setup_example(&local_1a8);
      }
      ppVar10 = Search::predictor::set_input((predictor *)&local_400,local_1a8.ec);
      ppVar10 = Search::predictor::set_allowed
                          (ppVar10,(vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                    *)&local_538);
      aVar7 = Search::predictor::predict(ppVar10);
      if (aVar7 == 1) {
        cVar6 = '$';
      }
      else if (aVar7 == 2) {
        cVar6 = ' ';
      }
      else {
        cVar6 = '_';
        if (aVar7 - 3 < 0x1a) {
          cVar6 = (char)aVar7 + '^';
        }
      }
      Search::predictor::~predictor((predictor *)&local_400);
      if (cVar6 != '$') {
        std::__cxx11::string::push_back((char)local_508);
        IncrementalEditDistance::append(&local_238,cVar6);
        if (pTVar11 == (Trie *)0x0) {
          pTVar11 = (Trie *)0x0;
        }
        else {
          pTVar11 = Trie::step(pTVar11,cVar6);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_538._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p);
      }
      ezexample::~ezexample(&local_1a8);
      if (cVar6 == '$') break;
      local_518 = local_518 + 1;
      local_478 = local_478 + 1;
    } while (local_518 != local_410);
  }
  iVar8 = (int)local_238.N;
  if (-1 < iVar8) {
    uVar12 = local_238.N & 0xffffffff;
    do {
      iVar8 = (int)uVar12;
      if (local_238.prev_row[uVar12] <= local_238.prev_row_min) goto LAB_0011b5ee;
      uVar12 = (ulong)(iVar8 - 1);
    } while (0 < iVar8);
    iVar8 = -1;
  }
LAB_0011b5ee:
  uVar12 = (local_238.N - (long)iVar8) * local_238.ins_cost + local_238.prev_row_min;
  local_480->dist = uVar12;
  Search::search::loss(local_488,(float)uVar12 * local_4e0->weight);
  std::vector<nextstr,_std::allocator<nextstr>_>::~vector(&local_4c8);
  IncrementalEditDistance::~IncrementalEditDistance(&local_238);
  return;
}

Assistant:

void _run(Search::search& sch, input& in, output& out)
  { IncrementalEditDistance ied(in.out);

    Trie* cdict = dict;

    v_array<action> ref = v_init<action>();
    int N = in.in.length();
    out = "^";
    vector<nextstr> next;
    for (int m=1; m<=N*2; m++)     // at most |in|*2 outputs
    { ezexample ex(&vw_obj);

      // length info
      ex(vw_namespace('l'))
      ("in", (float)N)
      ("out", (float)m);
      if (N != m)
        ex("diff", (float)(N-m));

      // suffixes thus far
      ex(vw_namespace('s'));
      string tmp("$");
      for (int i=m; i >= m-15 && i >= 0; i--)
      { tmp = out[i] + tmp;
        ex("p=" + tmp);
      }

      // characters thus far
      ex(vw_namespace('c'));
      for (char c : out) ex("c=" + string(1,c));
      ex("c=$");

      // words thus far
      ex(vw_namespace('w'));
      tmp = "";
      for (char c : out)
      { if (c == '^') continue;
        if (c == ' ')
        { ex("w=" + tmp + "$");
          tmp = "";
        }
        else tmp += c;
      }
      ex("w=" + tmp);

      // do we match the trie?
      if (cdict)
      { next.clear();
        cdict->get_next(nullptr, next);
        ex(vw_namespace('d'));
        char best_char = '~'; float best_count = 0.;
        for (auto xx : next)
        { if (xx.cw > 0.) ex("c=" + string(1,xx.c), xx.cw);
          if (xx.sw > 0.) ex("mc=" + xx.s, xx.sw);
          if (xx.sw > best_count) { best_count = xx.sw; best_char = xx.c; }
        }
        if (best_count > 0.)
          ex("best=" + string(1,best_char), best_count);
      }

      // input
      /*
      ex(vw_namespace('i'));
      ex("c=^");
      for (int n=0; n<N; n++)
        ex("c=" + in.in[n]);
      ex("c=$");
      */
      ex(vw_namespace('i'));
      tmp = "";
      for (char c : in.in)
      { if (c == ' ')
        { ex("w=" + tmp);
          tmp = "";
        }
        else tmp += c;
      }
      ex("w=" + tmp);

      ref.clear();

      /*
      vector<char>& best = ied.next();
      if (best.size() == 0) ref.push_back( char2action('$') );
      else for (char c : best) ref.push_back( char2action(c) );
      char c = action2char( Search::predictor(sch, m)
                            .set_input(* ex.get())
                            .set_oracle(ref)
                            .predict() );
      */

      vector< pair<action,float> > all = ied.all_next();
      char c = action2char( Search::predictor(sch, m)
                            .set_input(* ex.get())
                            .set_allowed(all)
                            .predict() );

      if (c == '$') break;
      out += c;
      ied.append(c);
      if (cdict) cdict = cdict->step(c);
    }

    dist = ied.finish_distance();
    sch.loss((float)dist * in.weight);
  }